

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bulk.c
# Opt level: O0

void ecs_bulk_delete(ecs_world_t *world,ecs_filter_t *filter)

{
  ecs_filter_t *filter_local;
  ecs_world_t *world_local;
  
  bulk_delete(world,filter,true);
  return;
}

Assistant:

void ecs_bulk_delete(
    ecs_world_t *world,
    const ecs_filter_t *filter)
{
    bulk_delete(world, filter, true);
}